

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

void __thiscall BigNumber::BigNumber(BigNumber *this,int64_t num)

{
  pointer *ppcVar1;
  char *pcVar2;
  iterator __position;
  pointer pcVar3;
  pointer pcVar4;
  double dVar5;
  int iVar6;
  pointer pcVar7;
  int iVar8;
  char local_31 [8];
  digit_t digit;
  
  this->_vptr_BigNumber = (_func_int **)&PTR__BigNumber_00105d98;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (num < 0) {
    this->m_symbol = NEGATIVE;
    num = -num;
  }
  else {
    this->m_symbol = POSITIVE;
  }
  if (num == 0) {
    iVar6 = 1;
  }
  else {
    dVar5 = log10((double)num);
    iVar6 = (int)(dVar5 + 1.0);
  }
  if (0 < iVar6) {
    iVar8 = iVar6;
    do {
      __position._M_current =
           (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&this->m_digits,__position,local_31);
      }
      else {
        *__position._M_current = (char)num + (char)((ulong)num / 10) * -10;
        ppcVar1 = &(this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      iVar8 = iVar8 + -1;
      num = (ulong)num / 10;
    } while (iVar8 != 0);
  }
  if (iVar6 < 2) {
    return;
  }
  pcVar3 = (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar3) {
    if (pcVar4[-1] != '\0') {
      return;
    }
    do {
      pcVar7 = pcVar4 + -1;
      (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar7;
      if (pcVar7 == pcVar3) goto LAB_00101832;
      pcVar2 = pcVar4 + -2;
      pcVar4 = pcVar7;
    } while (*pcVar2 == '\0');
    if (pcVar7 != pcVar3) {
      return;
    }
  }
LAB_00101832:
  this->m_symbol = ZERO;
  return;
}

Assistant:

BigNumber::BigNumber(int64_t num)
{
    if (num<0)
    {
        m_symbol = NEGATIVE;
        num=-num;
    }
    else
        m_symbol = POSITIVE;
    int len = 1;
    if(num!=0)
        len=log10(num)+1;
    for (int i =0; i<len; ++i)
    {
        digit_t digit;
        digit=num%10;
        num=num/10;
        m_digits.push_back(digit);
    }
    if(len>1) {
        trim();
    }
}